

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O0

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:578:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:578:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  value *this__local;
  impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:578:52)>
  *this_local;
  
  anon_class_16_1_570cf4e1_for_f::operator()(__return_storage_ptr__,&this->f,this_,args);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }